

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitThrow
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Throw *curr)

{
  undefined1 auStack_78 [8];
  Literals arguments;
  Literal local_38;
  
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
  _M_str = (char *)0x0;
  auStack_78 = (undefined1  [8])0x0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  generateArguments(__return_storage_ptr__,this,&curr->operands,(Literals *)auStack_78);
  if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0) {
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    wasm::Literal::~Literal((Literal *)&arguments);
    return __return_storage_ptr__;
  }
  makeExnData(&local_38,this,(Name)(curr->tag).super_IString.str,(Literals *)auStack_78);
  (*this->_vptr_ExpressionRunner[4])(this,&local_38);
  wasm::Literal::~Literal(&local_38);
  wasm::handle_unreachable
            ("throw",
             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
             ,0x623);
}

Assistant:

Flow visitThrow(Throw* curr) {
    NOTE_ENTER("Throw");
    Literals arguments;
    Flow flow = generateArguments(curr->operands, arguments);
    if (flow.breaking()) {
      return flow;
    }
    NOTE_EVAL1(curr->tag);
    throwException(WasmException{makeExnData(curr->tag, arguments)});
    WASM_UNREACHABLE("throw");
  }